

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O2

int run_test_getsockname_tcp(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sStack_50;
  int local_3c;
  sockaddr sockname;
  sockaddr_in addr;
  sockaddr peername;
  
  loop = uv_default_loop();
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 != 0) {
    pcVar4 = "0 == uv_ip4_addr(\"0.0.0.0\", server_port, &addr)";
    uVar3 = 0xaf;
LAB_0012d4d1:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,uVar3,pcVar4);
    abort();
  }
  iVar1 = uv_tcp_init(loop,&tcpServer);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_bind(&tcpServer,(sockaddr *)&addr,0);
    if (iVar1 == 0) {
      iVar1 = uv_listen((uv_stream_t *)&tcpServer,0x80,on_connection);
      if (iVar1 == 0) {
        sockname.sa_family = 0xffff;
        sockname.sa_data[0] = -1;
        sockname.sa_data[1] = -1;
        sockname.sa_data[2] = -1;
        sockname.sa_data[3] = -1;
        sockname.sa_data[4] = -1;
        sockname.sa_data[5] = -1;
        sockname.sa_data[6] = -1;
        sockname.sa_data[7] = -1;
        sockname.sa_data[8] = -1;
        sockname.sa_data[9] = -1;
        sockname.sa_data[10] = -1;
        sockname.sa_data[0xb] = -1;
        sockname.sa_data[0xc] = -1;
        sockname.sa_data[0xd] = -1;
        local_3c = 0x10;
        iVar1 = uv_tcp_getsockname(&tcpServer,&sockname,&local_3c);
        if (iVar1 == 0) {
          check_sockname(&sockname,"0.0.0.0",0x23a3,"server socket");
          getsocknamecount = getsocknamecount + 1;
          local_3c = 0x10;
          iVar1 = uv_tcp_getpeername(&tcpServer,&peername,&local_3c);
          if (iVar1 == -0x6b) {
            getpeernamecount = getpeernamecount + 1;
            iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
            if (iVar1 == 0) {
              iVar1 = uv_tcp_init(loop,&tcp);
              tcp.data = &connect_req;
              if (iVar1 == 0) {
                iVar1 = uv_tcp_connect(&connect_req,&tcp,(sockaddr *)&addr,on_connect);
                if (iVar1 == 0) {
                  peername.sa_family = 0x10;
                  peername.sa_data[0] = '\0';
                  peername.sa_data[1] = '\0';
                  iVar1 = uv_tcp_getsockname(&tcp,&sockname,(int *)&peername);
                  if (iVar1 == 0) {
                    if (sockname.sa_family == 2) {
                      connect_port = (int)(ushort)(sockname.sa_data._0_2_ << 8 |
                                                  (ushort)sockname.sa_data._0_2_ >> 8);
                      if (sockname.sa_data._0_2_ == 0) {
                        pcVar4 = "connect_port > 0";
                        uVar3 = 0xea;
                      }
                      else {
                        uv_run(loop,UV_RUN_DEFAULT);
                        if (getsocknamecount == 3) {
                          if (getpeernamecount == 3) {
                            puVar2 = uv_default_loop();
                            close_loop(puVar2);
                            puVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(puVar2);
                            if (iVar1 == 0) {
                              return 0;
                            }
                            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                            uVar3 = 0x153;
                          }
                          else {
                            pcVar4 = "getpeernamecount == 3";
                            uVar3 = 0x151;
                          }
                        }
                        else {
                          pcVar4 = "getsocknamecount == 3";
                          uVar3 = 0x150;
                        }
                      }
                    }
                    else {
                      pcVar4 = "sockname.sa_family == AF_INET";
                      uVar3 = 0xe8;
                    }
                  }
                  else {
                    pcVar4 = "!r";
                    uVar3 = 0xe7;
                  }
                }
                else {
                  pcVar4 = "!r";
                  uVar3 = 0xe2;
                }
              }
              else {
                pcVar4 = "!r";
                uVar3 = 0xdc;
              }
            }
            else {
              pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", server_port, &server_addr)";
              uVar3 = 0xd8;
            }
          }
          else {
            pcVar4 = "r == UV_ENOTCONN";
            uVar3 = 0xcc;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0xc6;
        }
        goto LAB_0012d4d1;
      }
      pcVar4 = "Listen error\n";
      sStack_50 = 0xd;
    }
    else {
      pcVar4 = "Bind error\n";
      sStack_50 = 0xb;
    }
  }
  else {
    pcVar4 = "Socket creation error\n";
    sStack_50 = 0x16;
  }
  fwrite(pcVar4,sStack_50,1,_stderr);
  return 1;
}

Assistant:

TEST_IMPL(getsockname_tcp) {
  loop = uv_default_loop();

  if (tcp_listener())
    return 1;

  tcp_connector();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(getsocknamecount == 3);
  ASSERT(getpeernamecount == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}